

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall
TimesAll<0,0,0>::propagate_xy_min<0,0>
          (TimesAll<0,_0,_0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,
          int64_t z_min,int64_t z_max)

{
  bool bVar1;
  long *plVar2;
  int64_t iVar3;
  Lit *pLVar4;
  IntView<0> *in_RDI;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  Reason m_r;
  int64_t m_v;
  Clause *reason;
  int64_t u_min_new;
  IntView<0> *in_stack_ffffffffffffff68;
  IntView<0> *m;
  undefined1 channel;
  IntView<0> *this_00;
  anon_union_8_2_743a5d44_for_Reason_0 local_78;
  IntView<0> *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Clause *local_58;
  long local_50;
  long local_48;
  IntView<0> *local_40 [8];
  
  local_40[0] = (IntView<0> *)0x0;
  if (in_stack_00000008 < 0) {
    if (in_stack_00000010 < 1) {
      local_40[0] = (IntView<0> *)(((-in_R9 - in_stack_00000018) + -1) / -in_R9);
    }
    else {
      local_40[0] = (IntView<0> *)
                    (((in_stack_00000018 - in_stack_00000008) + -1) / in_stack_00000008);
    }
  }
  else if (in_R9 < 1) {
    local_48 = -in_stack_00000010;
    plVar2 = std::min<long>(&local_48,&stack0x00000010);
    local_40[0] = (IntView<0> *)*plVar2;
    plVar2 = std::min<long>((long *)local_40,&stack0x00000018);
    local_40[0] = (IntView<0> *)*plVar2;
    local_50 = -in_stack_00000018;
    plVar2 = std::min<long>((long *)local_40,&local_50);
    local_40[0] = (IntView<0> *)*plVar2;
  }
  else if (in_stack_00000010 < 1) {
    local_40[0] = (IntView<0> *)(((in_R9 - in_stack_00000010) + -1) / -in_R9);
  }
  else {
    local_40[0] = (IntView<0> *)((in_stack_00000010 + in_stack_00000008 + -1) / in_stack_00000008);
  }
  this_00 = local_40[0];
  iVar3 = IntView<0>::getMin(local_40[0]);
  if (iVar3 < (long)this_00) {
    local_58 = (Clause *)0x0;
    if ((so.lazy & 1U) != 0) {
      local_58 = ::Reason_new((int)((ulong)this_00 >> 0x20));
      local_5c = (int)IntView<0>::getMinLit(in_stack_ffffffffffffff68);
      pLVar4 = Clause::operator[]((Clause *)this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20))
      ;
      pLVar4->x = local_5c;
      local_60 = (int)IntView<0>::getMaxLit(in_stack_ffffffffffffff68);
      pLVar4 = Clause::operator[]((Clause *)this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20))
      ;
      pLVar4->x = local_60;
      local_64 = (int)IntView<0>::getMinLit(in_stack_ffffffffffffff68);
      pLVar4 = Clause::operator[]((Clause *)this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20))
      ;
      pLVar4->x = local_64;
      local_68 = (int)IntView<0>::getMaxLit(in_stack_ffffffffffffff68);
      pLVar4 = Clause::operator[]((Clause *)this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20))
      ;
      pLVar4->x = local_68;
    }
    m = local_40[0];
    if (local_40[0] == (IntView<0> *)0x0) {
      m = (IntView<0> *)0x1;
    }
    local_70 = m;
    bVar1 = IntView<0>::setMinNotR(this_00,(int64_t)m);
    channel = (undefined1)((ulong)m >> 0x38);
    if (bVar1) {
      Reason::Reason((Reason *)&local_78,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        Reason::Reason((Reason *)&local_78,local_58);
      }
      bVar1 = IntView<0>::setMin(in_RDI,(int64_t)this_00,(Reason)local_78,(bool)channel);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate_xy_min(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
												const int64_t z_min, const int64_t z_max) {
		assert(z_min > 0 || z_max < 0);
		assert(v_min != 0 && v_max != 0);
		// The product z cannot be 0. Then x and y cannot be 0, too.
		// x >= ceil(z / y)
		int64_t u_min_new = 0;
		if (v_max < 0) {
			// Integer variable v is negative
			if (z_min > 0) {
				// Integer variable z is positive
				u_min_new = (z_max - v_max - 1) / v_max;
			} else {
				// Integer variable z is negative
				u_min_new = (-z_max - v_min - 1) / -v_min;
			}
		} else if (v_min > 0) {
			// Integer variable is positive
			if (z_min > 0) {
				// Integer variable z is positive
				u_min_new = (z_min + v_max - 1) / v_max;
			} else {
				// Integer variable z is negative
				u_min_new = (-z_min + v_min - 1) / -v_min;
			}
		} else {
			// The domain of integer variable v contains -1 and 1
			u_min_new = std::min(-1 * z_min, z_min);
			u_min_new = std::min(u_min_new, z_max);
			u_min_new = std::min(u_min_new, -1 * z_max);
		}

		if (u_min_new > u.getMin()) {
			// TODO Better explanation
			Clause* reason = nullptr;
			if (so.lazy) {
				reason = Reason_new(5);
				(*reason)[1] = v.getMinLit();
				(*reason)[2] = v.getMaxLit();
				(*reason)[3] = z.getMinLit();
				(*reason)[4] = z.getMaxLit();
			}
			setDom(u, setMin, (u_min_new == 0 ? 1 : u_min_new), reason);
		}

		return true;
	}